

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMockerBase<bool_()>::PerformDefaultAction
          (FunctionMockerBase<bool_()> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<bool_()> *this_00;
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  Result RVar4;
  undefined1 uVar5;
  Action<bool_()> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar6;
  string message;
  undefined **local_58;
  undefined8 local_50;
  undefined *local_48 [2];
  string *local_38;
  
  ppvVar6 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = call_description;
  while (ppvVar6 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<bool_()> *)ppvVar6[-1];
    ppvVar6 = ppvVar6 + -1;
    local_50 = 0;
    local_58 = &PTR__MatchResultListener_001ac0d8;
    plVar1 = *(long **)(this_00 + 0x20);
    cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,args,&local_58);
    if (cVar3 != '\0') {
      this_01 = OnCallSpec<bool_()>::GetAction(this_00);
      RVar4 = Action<bool_()>::Perform(this_01,args);
      return RVar4;
    }
  }
  pcVar2 = (local_38->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + local_38->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  if (DefaultValue<bool>::producer_ == (long *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (**(code **)(*DefaultValue<bool>::producer_ + 0x10))();
  }
  if (local_58 == local_48) {
    return (Result)uVar5;
  }
  operator_delete(local_58,(ulong)(local_48[0] + 1));
  return (Result)uVar5;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }